

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::MethodDescriptorProto::_InternalParse
          (MethodDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  byte bVar2;
  MethodOptions *msg;
  ulong uVar3;
  char cVar4;
  uint32 res;
  uint uVar5;
  Arena *pAVar6;
  string *s;
  byte *p;
  uint uVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  pair<const_char_*,_bool> pVar10;
  
  this_00 = &this->output_type_;
  this_01 = &this->input_type_;
  this_02 = &this->name_;
  uVar7 = 0;
LAB_00172b7e:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_00172e51;
      pVar10 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar10.first;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00172e51;
    }
    bVar1 = *ptr;
    pVar8.second._0_1_ = bVar1;
    pVar8.first = (char *)((byte *)ptr + 1);
    pVar8._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar8 = internal::ReadTagFallback(ptr,res);
        if (pVar8.first == (char *)0x0) goto LAB_00172e67;
      }
      else {
        pVar8.second = res;
        pVar8.first = (char *)((byte *)ptr + 2);
        pVar8._12_4_ = 0;
      }
    }
    p = (byte *)pVar8.first;
    uVar5 = pVar8.second;
    cVar4 = (char)pVar8.second;
    switch((uint)(pVar8._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      if (cVar4 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar6 = (Arena *)(this->_internal_metadata_).
                        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        .ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
      }
      s = this_02->ptr_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_02,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_02->ptr_;
      }
LAB_00172d46:
      ptr = internal::InlineGreedyStringParser(s,(char *)p,ctx);
      goto LAB_00172dbd;
    case 2:
      if (cVar4 == '\x12') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pAVar6 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
        }
        s = this_01->ptr_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_01,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          s = this_01->ptr_;
        }
        goto LAB_00172d46;
      }
      break;
    case 3:
      if (cVar4 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pAVar6 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
        }
        s = this_00->ptr_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          s = this_00->ptr_;
        }
        goto LAB_00172d46;
      }
      break;
    case 4:
      if (cVar4 == '\"') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        msg = this->options_;
        if (msg == (MethodOptions *)0x0) {
          pAVar6 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar6 & 1) != 0) {
            pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
          }
          msg = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(pAVar6);
          this->options_ = msg;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::MethodOptions>
                        (ctx,msg,(char *)p);
        goto LAB_00172dbd;
      }
      break;
    case 5:
      if (cVar4 == '(') {
        uVar7 = uVar7 | 0x10;
        uVar3 = (ulong)(char)*p;
        ptr = (char *)(p + 1);
        if ((long)uVar3 < 0) {
          uVar5 = ((uint)*p + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar9 = internal::VarintParseSlow64((char *)p,uVar5);
            ptr = pVar9.first;
            this->client_streaming_ = pVar9.second != 0;
            goto LAB_00172dbd;
          }
          uVar3 = (ulong)uVar5;
          ptr = (char *)(p + 2);
        }
        this->client_streaming_ = uVar3 != 0;
        goto LAB_00172b7e;
      }
      break;
    case 6:
      if (cVar4 == '0') {
        uVar7 = uVar7 | 0x20;
        uVar3 = (ulong)(char)*p;
        ptr = (char *)(p + 1);
        if ((long)uVar3 < 0) {
          uVar5 = ((uint)*p + (uint)(byte)*ptr * 0x80) - 0x80;
          if (*ptr < '\0') {
            pVar9 = internal::VarintParseSlow64((char *)p,uVar5);
            ptr = pVar9.first;
            this->server_streaming_ = pVar9.second != 0;
            goto LAB_00172dbd;
          }
          uVar3 = (ulong)uVar5;
          ptr = (char *)(p + 2);
        }
        this->server_streaming_ = uVar3 != 0;
        goto LAB_00172b7e;
      }
    }
    if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
      ptr = (char *)p;
      goto LAB_00172e51;
    }
    ptr = internal::UnknownFieldParse(uVar5,&this->_internal_metadata_,(char *)p,ctx);
LAB_00172dbd:
    if ((byte *)ptr == (byte *)0x0) {
LAB_00172e67:
      ptr = (char *)(byte *)0x0;
LAB_00172e51:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar7;
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* MethodDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.MethodDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string input_type = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_input_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.input_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string output_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_output_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.output_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool client_streaming = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_client_streaming(&has_bits);
          client_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool server_streaming = 6 [default = false];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          _Internal::set_has_server_streaming(&has_bits);
          server_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}